

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O3

int __thiscall p2t::Triangle::EdgeIndex(Triangle *this,Point *p1,Point *p2)

{
  Point *pPVar1;
  Point *pPVar2;
  
  pPVar1 = this->points_[0];
  pPVar2 = this->points_[1];
  if (pPVar1 == p1) {
    if (pPVar2 == p2) {
      return 2;
    }
    if (this->points_[2] == p2) {
      return 1;
    }
  }
  else if (pPVar2 == p1) {
    if (this->points_[2] == p2) {
      return 0;
    }
    if (pPVar1 == p2) {
      return 2;
    }
  }
  else if (this->points_[2] == p1) {
    if (pPVar1 == p2) {
      return 1;
    }
    if (pPVar2 == p2) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int Triangle::EdgeIndex(const Point* p1, const Point* p2)
{
  if (points_[0] == p1) {
    if (points_[1] == p2) {
      return 2;
    } else if (points_[2] == p2) {
      return 1;
    }
  } else if (points_[1] == p1) {
    if (points_[2] == p2) {
      return 0;
    } else if (points_[0] == p2) {
      return 2;
    }
  } else if (points_[2] == p1) {
    if (points_[0] == p2) {
      return 1;
    } else if (points_[1] == p2) {
      return 0;
    }
  }
  return -1;
}